

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O1

void spki_table_notify_diff(spki_table *new_table,spki_table *old_table,rtr_socket *socket)

{
  spki_update_fp p_Var1;
  uint8_t *puVar2;
  spki_update_fp p_Var3;
  int iVar4;
  long lVar5;
  tommy_list ptVar6;
  uint8_t *puVar7;
  spki_record *psVar8;
  uint8_t *puVar9;
  undefined8 *puVar10;
  long in_FS_OFFSET;
  byte bVar11;
  spki_record record;
  spki_record in_stack_fffffffffffffeb8;
  spki_record local_b8;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = old_table->update_fp;
  old_table->update_fp = (spki_update_fp)0x0;
  ptVar6 = new_table->list;
  if (ptVar6 != (tommy_list)0x0) {
    do {
      puVar2 = (uint8_t *)ptVar6->data;
      if (*(rtr_socket **)(puVar2 + 0x78) == socket) {
        local_b8.asn = *(uint32_t *)(puVar2 + 0x14);
        local_b8.socket = *(rtr_socket **)(puVar2 + 0x78);
        local_b8.ski._16_4_ = *(undefined4 *)(puVar2 + 0x10);
        local_b8.ski._0_8_ = *(undefined8 *)puVar2;
        local_b8.ski._8_8_ = *(undefined8 *)(puVar2 + 8);
        puVar7 = puVar2 + 0x18;
        puVar9 = local_b8.spki;
        for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)puVar9 = *(undefined8 *)puVar7;
          puVar7 = puVar7 + (ulong)bVar11 * -0x10 + 8;
          puVar9 = puVar9 + ((ulong)bVar11 * -2 + 1) * 8;
        }
        local_b8.spki._88_2_ = *(undefined2 *)(puVar2 + 0x70);
        local_b8.spki[0x5a] = puVar2[0x72];
        iVar4 = spki_table_remove_entry(old_table,&local_b8);
        if ((iVar4 == -3) && (p_Var3 = new_table->update_fp, p_Var3 != (spki_update_fp)0x0)) {
          psVar8 = &local_b8;
          puVar10 = (undefined8 *)&stack0xfffffffffffffeb8;
          for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar10 = *(undefined8 *)psVar8->ski;
            psVar8 = (spki_record *)((long)psVar8 + (ulong)bVar11 * -0x10 + 8);
            puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          }
          (*p_Var3)(new_table,in_stack_fffffffffffffeb8,true);
        }
      }
      ptVar6 = ptVar6->next;
    } while (ptVar6 != (tommy_node_struct *)0x0);
  }
  ptVar6 = old_table->list;
  if (ptVar6 != (tommy_list)0x0) {
    do {
      puVar2 = (uint8_t *)ptVar6->data;
      if (*(rtr_socket **)(puVar2 + 0x78) == socket) {
        local_b8.asn = *(uint32_t *)(puVar2 + 0x14);
        local_b8.socket = *(rtr_socket **)(puVar2 + 0x78);
        local_b8.ski._16_4_ = *(undefined4 *)(puVar2 + 0x10);
        local_b8.ski._0_8_ = *(undefined8 *)puVar2;
        local_b8.ski._8_8_ = *(undefined8 *)(puVar2 + 8);
        puVar7 = puVar2 + 0x18;
        puVar9 = local_b8.spki;
        for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)puVar9 = *(undefined8 *)puVar7;
          puVar7 = puVar7 + (ulong)bVar11 * -0x10 + 8;
          puVar9 = puVar9 + ((ulong)bVar11 * -2 + 1) * 8;
        }
        local_b8.spki[0x5a] = puVar2[0x72];
        local_b8.spki._88_2_ = *(undefined2 *)(puVar2 + 0x70);
        p_Var3 = new_table->update_fp;
        if (p_Var3 != (spki_update_fp)0x0) {
          psVar8 = &local_b8;
          puVar10 = (undefined8 *)&stack0xfffffffffffffeb8;
          for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar10 = *(undefined8 *)psVar8->ski;
            psVar8 = (spki_record *)((long)psVar8 + ((ulong)bVar11 * -2 + 1) * 8);
            puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          }
          (*p_Var3)(new_table,in_stack_fffffffffffffeb8,false);
        }
      }
      ptVar6 = ptVar6->next;
    } while (ptVar6 != (tommy_node_struct *)0x0);
  }
  old_table->update_fp = p_Var1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void spki_table_notify_diff(struct spki_table *new_table, struct spki_table *old_table, const struct rtr_socket *socket)
{
	spki_update_fp old_table_fp;

	// Disable update callback for old_table
	old_table_fp = old_table->update_fp;
	old_table->update_fp = NULL;

	// Iterate new_table and try to delete every entry from the given socket
	// in old_table If the prefix could not be removed it was added in
	// new_table and the update cb must be called
	for (tommy_node *current_node = tommy_list_head(&new_table->list); current_node;
	     current_node = current_node->next) {
		struct key_entry *entry = (struct key_entry *)current_node->data;

		if (entry->socket == socket) {
			struct spki_record record;

			key_entry_to_spki_record(entry, &record);

			if (spki_table_remove_entry(old_table, &record) == SPKI_RECORD_NOT_FOUND)
				spki_table_notify_clients(new_table, &record, true);
		}
	}

	// Iterate old_table and call cb for every remianing entry from the
	// given socket with added false because it is not present in new_table
	for (tommy_node *current_node = tommy_list_head(&old_table->list); current_node;
	     current_node = current_node->next) {
		struct key_entry *entry = (struct key_entry *)current_node->data;

		if (entry->socket == socket) {
			struct spki_record record;

			key_entry_to_spki_record(entry, &record);
			spki_table_notify_clients(new_table, &record, false);
		}
	}

	// Restore original state of old_tables update_fp
	old_table->update_fp = old_table_fp;
}